

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_test.cpp
# Opt level: O2

void model_test::removeTest(void)

{
  ModelImpl *this;
  SystemImpl *this_00;
  SystemImpl *this_01;
  FlowExp *this_02;
  
  this = (ModelImpl *)operator_new(0x60);
  ModelImpl::ModelImpl(this);
  this_00 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_00);
  this_01 = (SystemImpl *)operator_new(0x30);
  SystemImpl::SystemImpl(this_01);
  this_02 = (FlowExp *)operator_new(0x38);
  FlowExp::FlowExp(this_02,(System *)this_00,(System *)this_01);
  (**(code **)(*(long *)this + 8))(this,this_02);
  (**(code **)(*(long *)this + 0x18))(this,this_02);
  return;
}

Assistant:

void model_test::removeTest() {
    auto *m = new ModelImpl();
    auto *s1 = new SystemImpl();
    auto *s2 = new SystemImpl();
    auto *f = new FlowExp(s1, s2);
    m->add(f);
    m->remove(f);
//    assert(m->flowContainer.size() == 0);
}